

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
cs::instance_type::check_define_structured_binding(instance_type *this,iterator it,bool regist)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  token_base **pptVar4;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *pdVar5;
  undefined8 uVar6;
  var_id *this_00;
  byte in_DL;
  tree_node *in_RDI;
  token_base *root;
  tree_type<cs::token_base_*> *p_it;
  iterator __end1;
  iterator __begin1;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range1;
  _Self *in_stack_fffffffffffffee8;
  runtime_error *in_stack_fffffffffffffef0;
  allocator local_d9;
  string local_d8 [8];
  iterator *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff58;
  domain_manager *in_stack_ffffffffffffff60;
  string local_98 [32];
  tree_node *local_78;
  token_id *local_70;
  reference local_68;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_40;
  undefined7 in_stack_ffffffffffffffe8;
  iterator it_00;
  
  bVar1 = in_DL & 1;
  it_00.mData = in_RDI;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff30);
  pdVar5 = token_parallel::get_parallel((token_parallel *)*pptVar4);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffffee8);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *)
      in_stack_fffffffffffffee8);
  while( true ) {
    bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (!bVar2) {
      return;
    }
    local_68 = std::
               _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
               ::operator*(&local_40);
    local_78 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffee8);
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff30);
    local_70 = (token_id *)*pptVar4;
    if (local_70 == (token_id *)0x0) break;
    iVar3 = (*(local_70->super_token_base)._vptr_token_base[2])();
    if (iVar3 == 4) {
      if ((bVar1 & 1) != 0) {
        in_stack_fffffffffffffef0 = (runtime_error *)&in_RDI[1].right;
        this_00 = token_id::get_id(local_70);
        var_id::operator_cast_to_string_(this_00);
        domain_manager::add_record(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    else {
      iVar3 = (*(local_70->super_token_base)._vptr_token_base[2])();
      if (iVar3 != 0xf) {
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d8,"Wrong grammar for variable definition(8).",&local_d9)
        ;
        runtime_error::runtime_error(in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffee8);
        __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffee8);
      check_define_structured_binding
                ((instance_type *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),it_00,
                 SUB81((ulong)pdVar5 >> 0x38,0));
    }
    std::
    _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
    ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  *)in_stack_fffffffffffffef0);
  }
  uVar6 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"Wrong grammar for variable definition(7).",
             (allocator *)&stack0xffffffffffffff67);
  runtime_error::runtime_error(in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffee8);
  __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void
	instance_type::check_define_structured_binding(tree_type<token_base *>::iterator it, bool regist)
	{
		for (auto &p_it: static_cast<token_parallel *>(it.data())->get_parallel()) {
			token_base *root = p_it.root().data();
			if (root == nullptr)
				throw runtime_error("Wrong grammar for variable definition(7).");
			if (root->get_type() != token_types::id) {
				if (root->get_type() == token_types::parallel)
					check_define_structured_binding(p_it.root(), regist);
				else
					throw runtime_error("Wrong grammar for variable definition(8).");
			}
			else if (regist)
				storage.add_record(static_cast<token_id *>(root)->get_id());
		}
	}